

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UBool __thiscall
icu_63::UnicodeString::cloneArrayIfNeeded
          (UnicodeString *this,int32_t newCapacity,int32_t growCapacity,UBool doCopyArray,
          int32_t **pBufferToDelete,UBool forceClone)

{
  ushort uVar1;
  ushort uVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  char16_t *pcVar6;
  int32_t capacity;
  UChar oldStackBuffer [27];
  char16_t *local_80;
  char16_t local_68 [28];
  
  if ((newCapacity == -1) &&
     (newCapacity = 0x1b,
     (undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
     (undefined1  [56])0x0)) {
    newCapacity = (this->fUnion).fFields.fCapacity;
  }
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if (((forceClone == '\0') && ((uVar1 & 8) == 0)) &&
       (((uVar1 & 4) == 0 || (*(int *)((this->fUnion).fFields.fArray + -2) < 2)))) {
      iVar5 = 0x1b;
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        iVar5 = (this->fUnion).fFields.fCapacity;
      }
      if (newCapacity <= iVar5) {
        return '\x01';
      }
    }
    capacity = newCapacity;
    if (-1 < growCapacity) {
      capacity = 0x1b;
      if (growCapacity < 0x1b) {
        capacity = growCapacity;
      }
      if (0x1b < newCapacity) {
        capacity = growCapacity;
      }
    }
    uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      iVar5 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar1 >> 5;
    }
    if (((int)(short)uVar1 & 2U) == 0) {
      local_80 = (this->fUnion).fFields.fArray;
    }
    else {
      local_80 = (char16_t *)0x0;
      if ((doCopyArray != '\0') && (0x1b < capacity)) {
        if (iVar5 < 1) {
          local_80 = local_68;
        }
        else {
          local_80 = local_68;
          memcpy(local_80,(void *)((long)&this->fUnion + 2),(ulong)(uint)(iVar5 * 2));
        }
      }
    }
    UVar3 = allocate(this,capacity);
    if ((UVar3 != '\0') ||
       ((newCapacity < capacity && (UVar3 = allocate(this,newCapacity), UVar3 != '\0')))) {
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (doCopyArray == '\0') {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar2 & 0x1f;
      }
      else {
        iVar4 = 0x1b;
        if ((uVar2 & 2) == 0) {
          iVar4 = (this->fUnion).fFields.fCapacity;
        }
        if (iVar4 < iVar5) {
          iVar5 = iVar4;
        }
        if ((local_80 != (char16_t *)0x0) && (0 < iVar5)) {
          if ((uVar2 & 2) == 0) {
            pcVar6 = (this->fUnion).fFields.fArray;
          }
          else {
            pcVar6 = (char16_t *)((long)&this->fUnion + 2);
          }
          memmove(pcVar6,local_80,(ulong)(uint)(iVar5 * 2));
        }
        uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
        if (iVar5 < 0x400) {
          (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(iVar5 << 5) | uVar2 & 0x1f;
        }
        else {
          (this->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
          (this->fUnion).fFields.fLength = iVar5;
        }
      }
      if ((uVar1 & 4) != 0) {
        LOCK();
        pcVar6 = local_80 + -2;
        *(int *)pcVar6 = *(int *)pcVar6 + -1;
        UNLOCK();
        if (*(int *)pcVar6 == 0) {
          if (pBufferToDelete == (int32_t **)0x0) {
            uprv_free_63(local_80 + -2);
          }
          else {
            *pBufferToDelete = (int32_t *)(local_80 + -2);
          }
        }
      }
      return '\x01';
    }
    if ((uVar1 & 2) == 0) {
      (this->fUnion).fFields.fArray = local_80;
    }
    (this->fUnion).fStackFields.fLengthAndFlags = uVar1;
    setToBogus(this);
  }
  return '\0';
}

Assistant:

UBool
UnicodeString::cloneArrayIfNeeded(int32_t newCapacity,
                                  int32_t growCapacity,
                                  UBool doCopyArray,
                                  int32_t **pBufferToDelete,
                                  UBool forceClone) {
  // default parameters need to be static, therefore
  // the defaults are -1 to have convenience defaults
  if(newCapacity == -1) {
    newCapacity = getCapacity();
  }

  // while a getBuffer(minCapacity) is "open",
  // prevent any modifications of the string by returning FALSE here
  // if the string is bogus, then only an assignment or similar can revive it
  if(!isWritable()) {
    return FALSE;
  }

  /*
   * We need to make a copy of the array if
   * the buffer is read-only, or
   * the buffer is refCounted (shared), and refCount>1, or
   * the buffer is too small.
   * Return FALSE if memory could not be allocated.
   */
  if(forceClone ||
     fUnion.fFields.fLengthAndFlags & kBufferIsReadonly ||
     (fUnion.fFields.fLengthAndFlags & kRefCounted && refCount() > 1) ||
     newCapacity > getCapacity()
  ) {
    // check growCapacity for default value and use of the stack buffer
    if(growCapacity < 0) {
      growCapacity = newCapacity;
    } else if(newCapacity <= US_STACKBUF_SIZE && growCapacity > US_STACKBUF_SIZE) {
      growCapacity = US_STACKBUF_SIZE;
    }

    // save old values
    UChar oldStackBuffer[US_STACKBUF_SIZE];
    UChar *oldArray;
    int32_t oldLength = length();
    int16_t flags = fUnion.fFields.fLengthAndFlags;

    if(flags&kUsingStackBuffer) {
      U_ASSERT(!(flags&kRefCounted)); /* kRefCounted and kUsingStackBuffer are mutally exclusive */
      if(doCopyArray && growCapacity > US_STACKBUF_SIZE) {
        // copy the stack buffer contents because it will be overwritten with
        // fUnion.fFields values
        us_arrayCopy(fUnion.fStackFields.fBuffer, 0, oldStackBuffer, 0, oldLength);
        oldArray = oldStackBuffer;
      } else {
        oldArray = NULL; // no need to copy from the stack buffer to itself
      }
    } else {
      oldArray = fUnion.fFields.fArray;
      U_ASSERT(oldArray!=NULL); /* when stack buffer is not used, oldArray must have a non-NULL reference */
    }

    // allocate a new array
    if(allocate(growCapacity) ||
       (newCapacity < growCapacity && allocate(newCapacity))
    ) {
      if(doCopyArray) {
        // copy the contents
        // do not copy more than what fits - it may be smaller than before
        int32_t minLength = oldLength;
        newCapacity = getCapacity();
        if(newCapacity < minLength) {
          minLength = newCapacity;
        }
        if(oldArray != NULL) {
          us_arrayCopy(oldArray, 0, getArrayStart(), 0, minLength);
        }
        setLength(minLength);
      } else {
        setZeroLength();
      }

      // release the old array
      if(flags & kRefCounted) {
        // the array is refCounted; decrement and release if 0
        u_atomic_int32_t *pRefCount = ((u_atomic_int32_t *)oldArray - 1);
        if(umtx_atomic_dec(pRefCount) == 0) {
          if(pBufferToDelete == 0) {
              // Note: cast to (void *) is needed with MSVC, where u_atomic_int32_t
              // is defined as volatile. (Volatile has useful non-standard behavior
              //   with this compiler.)
            uprv_free((void *)pRefCount);
          } else {
            // the caller requested to delete it himself
            *pBufferToDelete = (int32_t *)pRefCount;
          }
        }
      }
    } else {
      // not enough memory for growCapacity and not even for the smaller newCapacity
      // reset the old values for setToBogus() to release the array
      if(!(flags&kUsingStackBuffer)) {
        fUnion.fFields.fArray = oldArray;
      }
      fUnion.fFields.fLengthAndFlags = flags;
      setToBogus();
      return FALSE;
    }
  }
  return TRUE;
}